

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::BlitDepthStencilCase::BlitDepthStencilCase
          (BlitDepthStencilCase *this,Context *context,char *name,char *desc,deUint32 format,
          deUint32 srcBuffers,IVec2 *srcSize,IVec4 *srcRect,deUint32 dstBuffers,IVec2 *dstSize,
          IVec4 *dstRect,deUint32 copyBuffers)

{
  int i_1;
  int i;
  long lVar1;
  
  lVar1 = 0;
  FboTestCase::FboTestCase(&this->super_FboTestCase,context,name,desc,false);
  (this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FboTestCase_0219c0a0;
  this->m_format = format;
  this->m_srcBuffers = srcBuffers;
  do {
    (this->m_srcSize).m_data[lVar1] = srcSize->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  lVar1 = 0;
  do {
    (this->m_srcRect).m_data[lVar1] = srcRect->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  this->m_dstBuffers = dstBuffers;
  lVar1 = 0;
  do {
    (this->m_dstSize).m_data[lVar1] = dstSize->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  lVar1 = 0;
  do {
    (this->m_dstRect).m_data[lVar1] = dstRect->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  this->m_copyBuffers = copyBuffers;
  return;
}

Assistant:

BlitDepthStencilCase (Context& context, const char* name, const char* desc, deUint32 format, deUint32 srcBuffers, const IVec2& srcSize, const IVec4& srcRect, deUint32 dstBuffers, const IVec2& dstSize, const IVec4& dstRect, deUint32 copyBuffers)
		: FboTestCase	(context, name, desc)
		, m_format		(format)
		, m_srcBuffers	(srcBuffers)
		, m_srcSize		(srcSize)
		, m_srcRect		(srcRect)
		, m_dstBuffers	(dstBuffers)
		, m_dstSize		(dstSize)
		, m_dstRect		(dstRect)
		, m_copyBuffers	(copyBuffers)
	{
	}